

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O1

double duckdb::Cast::Operation<unsigned_char,double>(uchar input)

{
  bool bVar1;
  InvalidInputException *this;
  uchar input_00;
  double result;
  double local_40;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_char,double>(input,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  this = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_char,double>(&local_38,(duckdb *)(ulong)input,input_00);
  InvalidInputException::InvalidInputException(this,&local_38);
  __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}